

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool __thiscall
Chainstate::ConnectTip
          (Chainstate *this,BlockValidationState *state,CBlockIndex *pindexNew,
          shared_ptr<const_CBlock> *pblock,ConnectTrace *connectTrace,
          DisconnectedBlockTransactions *disconnectpool)

{
  long lVar1;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  bool bVar2;
  undefined1 uVar3;
  CBlockIndex *pCVar4;
  type tVar5;
  type fmt;
  type args;
  Chainstate *pCVar6;
  long in_RDX;
  Chainstate *in_RDI;
  long in_FS_OFFSET;
  __pthread_internal_list *p_Var7;
  rep_conflict rVar8;
  rep_conflict rVar9;
  bool flushed;
  bool rv;
  CBlock *blockConnecting;
  time_point time_6;
  time_point time_5;
  time_point time_4;
  time_point time_3;
  time_point time_2;
  shared_ptr<CBlock> pblockNew;
  shared_ptr<const_CBlock> pthisBlock;
  time_point time_1;
  CCoinsViewCache view;
  undefined4 in_stack_fffffffffffff898;
  int in_stack_fffffffffffff89c;
  char *in_stack_fffffffffffff8a0;
  char *in_stack_fffffffffffff8a8;
  CBlockIndex *in_stack_fffffffffffff8b0;
  Chainstate *in_stack_fffffffffffff8b8;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *in_stack_fffffffffffff8c8;
  undefined7 in_stack_fffffffffffff8d0;
  undefined1 in_stack_fffffffffffff8d7;
  ValidationState<BlockValidationResult> *in_stack_fffffffffffff8d8;
  CCoinsView *in_stack_fffffffffffff8e0;
  ConstevalStringLiteral in_stack_fffffffffffff8e8;
  CBlockIndex *in_stack_fffffffffffff8f0;
  CBlock *in_stack_fffffffffffff8f8;
  BlockManager *in_stack_fffffffffffff900;
  undefined8 in_stack_fffffffffffff908;
  int iVar10;
  undefined8 in_stack_fffffffffffff920;
  uint nBlockHeight;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *in_stack_fffffffffffff928;
  CTxMemPool *in_stack_fffffffffffff930;
  ConstevalFormatString<3U> in_stack_fffffffffffff948;
  size_t in_stack_fffffffffffff950;
  char *in_stack_fffffffffffff958;
  rep_conflict in_stack_fffffffffffff960;
  ChainstateManager *in_stack_fffffffffffff968;
  type in_stack_fffffffffffff970;
  undefined7 in_stack_fffffffffffff978;
  Level level;
  CBlockIndex *pCVar11;
  char (*in_stack_fffffffffffffa50) [11];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa58;
  char *args_1;
  type in_stack_fffffffffffffa60;
  byte local_4d1;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined4 in_stack_fffffffffffffb6c;
  undefined8 in_stack_fffffffffffffb70;
  undefined8 in_stack_fffffffffffffb78;
  undefined1 local_470 [24];
  _Storage<uint256,_true> local_458;
  undefined8 local_430;
  BlockManager *local_428;
  ChainstateManager *local_420;
  pointer local_418;
  undefined1 local_410 [24];
  _Storage<uint256,_true> local_3f8;
  CBlockIndex *local_3d0;
  BlockManager *local_3c8;
  ChainstateManager *local_3c0;
  undefined8 local_3b8;
  undefined8 local_3b0;
  undefined8 local_3a8;
  undefined8 in_stack_fffffffffffffc60;
  undefined4 nManualPruneHeight;
  undefined1 local_360 [24];
  _Storage<uint256,_true> local_348;
  CBlockIndex *local_320;
  BlockManager *local_318;
  _Storage<uint256,_true> local_2f0;
  BlockManager *local_2c8;
  _Rb_tree_node_base local_2c0 [2];
  undefined8 local_278;
  undefined1 in_stack_fffffffffffffde7;
  CCoinsViewCache *in_stack_fffffffffffffde8;
  BlockValidationState *in_stack_fffffffffffffdf0;
  CBlock *in_stack_fffffffffffffdf8;
  undefined8 in_stack_fffffffffffffe00;
  
  nManualPruneHeight = (undefined4)((ulong)in_stack_fffffffffffffc60 >> 0x20);
  iVar10 = (int)((ulong)in_stack_fffffffffffff908 >> 0x20);
  nBlockHeight = (uint)((ulong)in_stack_fffffffffffff920 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            (in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,in_stack_fffffffffffff89c,
             (AnnotatedMixin<std::recursive_mutex> *)0x149471b);
  if (in_RDI->m_mempool != (CTxMemPool *)0x0) {
    AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
              (in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,in_stack_fffffffffffff89c,
               (AnnotatedMixin<std::recursive_mutex> *)0x1494752);
  }
  pCVar11 = *(CBlockIndex **)(in_RDX + 8);
  pCVar4 = CChain::Tip((CChain *)in_stack_fffffffffffff8a8);
  if (pCVar11 != pCVar4) {
    __assert_fail("pindexNew->pprev == m_chain.Tip()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0xc3e,
                  "bool Chainstate::ConnectTip(BlockValidationState &, CBlockIndex *, const std::shared_ptr<const CBlock> &, ConnectTrace &, DisconnectedBlockTransactions &)"
                 );
  }
  local_278 = std::chrono::_V2::steady_clock::now();
  level = (Level)pCVar11;
  std::shared_ptr<const_CBlock>::shared_ptr
            ((shared_ptr<const_CBlock> *)
             CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
  bVar2 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2> *)
                     CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
  if (bVar2) {
    bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),Trace)
    ;
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff8b8,
                 (char *)in_stack_fffffffffffff8b0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff8b8,
                 (char *)in_stack_fffffffffffff8b0);
      in_stack_fffffffffffff8a0 = "  - Using cached block\n";
      in_stack_fffffffffffff898 = 1;
      logging_function._M_str = (char *)in_stack_fffffffffffff968;
      logging_function._M_len = (size_t)in_stack_fffffffffffff960;
      source_file._M_str = in_stack_fffffffffffff958;
      source_file._M_len = in_stack_fffffffffffff950;
      LogPrintFormatInternal<>
                (logging_function,source_file,iVar10,(LogFlags)in_stack_fffffffffffff900,level,
                 (ConstevalFormatString<0U>)in_stack_fffffffffffff948.fmt);
    }
    std::shared_ptr<const_CBlock>::operator=
              ((shared_ptr<const_CBlock> *)in_stack_fffffffffffff8a8,
               (shared_ptr<const_CBlock> *)in_stack_fffffffffffff8a0);
  }
  else {
    std::make_shared<CBlock>();
    std::__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffff8a8);
    bVar2 = ::node::BlockManager::ReadBlockFromDisk
                      (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0
                      );
    if (bVar2) {
      std::shared_ptr<CBlock_const>::operator=
                ((shared_ptr<const_CBlock> *)in_stack_fffffffffffff8a8,
                 (shared_ptr<CBlock> *)in_stack_fffffffffffff8a0);
    }
    else {
      ChainstateManager::GetNotifications
                ((ChainstateManager *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898))
      ;
      ::_(in_stack_fffffffffffff8e8);
      local_4d1 = FatalError((Notifications *)in_stack_fffffffffffff8a8,
                             (BlockValidationState *)in_stack_fffffffffffff8a0,
                             (bilingual_str *)
                             CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
      bilingual_str::~bilingual_str
                ((bilingual_str *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
    }
    std::shared_ptr<CBlock>::~shared_ptr
              ((shared_ptr<CBlock> *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
    if (!bVar2) goto LAB_01495b5f;
  }
  std::__shared_ptr_access<const_CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<const_CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffff8a8);
  local_2c0[0]._0_8_ = std::chrono::_V2::steady_clock::now();
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
  bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),Trace);
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff8b8,
               (char *)in_stack_fffffffffffff8b0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff8b8,
               (char *)in_stack_fffffffffffff8b0);
    std::chrono::operator-
              ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffff8a0,
               (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
    local_2f0._0_8_ =
         Ticks<std::chrono::duration<double,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                   ((duration<long,_std::ratio<1L,_1000000000L>_>)in_stack_fffffffffffff8a8);
    in_stack_fffffffffffff8a8 = (char *)&local_2f0;
    in_stack_fffffffffffff8a0 = "  - Load block from disk: %.2fms\n";
    in_stack_fffffffffffff898 = 1;
    logging_function_00._M_str = (char *)in_stack_fffffffffffff968;
    logging_function_00._M_len = (size_t)in_stack_fffffffffffff960;
    source_file_00._M_str = in_stack_fffffffffffff958;
    source_file_00._M_len = in_stack_fffffffffffff950;
    LogPrintFormatInternal<double>
              (logging_function_00,source_file_00,iVar10,(LogFlags)in_stack_fffffffffffff900,level,
               (ConstevalFormatString<1U>)in_stack_fffffffffffff948.fmt,
               (double *)in_stack_fffffffffffffa50);
  }
  CoinsTip(in_stack_fffffffffffff8b8);
  CCoinsViewCache::CCoinsViewCache
            ((CCoinsViewCache *)in_stack_fffffffffffff8e8.lit,in_stack_fffffffffffff8e0,
             SUB81((ulong)in_stack_fffffffffffff8d8 >> 0x38,0));
  bVar2 = ConnectBlock((Chainstate *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                       in_stack_fffffffffffffdf0,(CBlockIndex *)connectTrace,
                       in_stack_fffffffffffffde8,(bool)in_stack_fffffffffffffde7);
  if ((in_RDI->m_chainman->m_options).signals != (ValidationSignals *)0x0) {
    ValidationSignals::BlockChecked
              ((ValidationSignals *)in_stack_fffffffffffff8f8,(CBlock *)in_stack_fffffffffffff8f0,
               (BlockValidationState *)in_stack_fffffffffffff8e8.lit);
  }
  if (bVar2) {
    local_318 = (BlockManager *)std::chrono::_V2::steady_clock::now();
    local_2c8 = local_318;
    local_320 = (CBlockIndex *)
                std::chrono::operator-
                          ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)in_stack_fffffffffffff8a0,
                           (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
    std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator+=
              ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffff8a8,
               (duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffff8a0);
    if (in_RDI->m_chainman->num_blocks_total < 1) {
      __assert_fail("m_chainman.num_blocks_total > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                    ,0xc62,
                    "bool Chainstate::ConnectTip(BlockValidationState &, CBlockIndex *, const std::shared_ptr<const CBlock> &, ConnectTrace &, DisconnectedBlockTransactions &)"
                   );
    }
    bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),Trace)
    ;
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff8b8,
                 (char *)in_stack_fffffffffffff8b0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff8b8,
                 (char *)in_stack_fffffffffffff8b0);
      std::chrono::operator-
                ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)in_stack_fffffffffffff8a0,
                 (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
      local_348._0_8_ =
           Ticks<std::chrono::duration<double,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                     ((duration<long,_std::ratio<1L,_1000000000L>_>)in_stack_fffffffffffff8a8);
      local_360._8_8_ = (in_RDI->m_chainman->time_connect_total).__r;
      local_360._16_8_ =
           Ticks<std::chrono::duration<double,std::ratio<1l,1l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                     ((duration<long,_std::ratio<1L,_1000000000L>_>)in_stack_fffffffffffff8a8);
      rVar8 = Ticks<std::chrono::duration<double,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                        ((duration<long,_std::ratio<1L,_1000000000L>_>)in_stack_fffffffffffff8a8);
      local_360._0_8_ = rVar8 / (double)in_RDI->m_chainman->num_blocks_total;
      in_stack_fffffffffffff8b8 = (Chainstate *)local_360;
      in_stack_fffffffffffff8b0 = (CBlockIndex *)(local_360 + 0x10);
      in_stack_fffffffffffff8a8 = (char *)&local_348;
      in_stack_fffffffffffff8a0 = "  - Connect total: %.2fms [%.2fs (%.2fms/blk)]\n";
      in_stack_fffffffffffff898 = 1;
      logging_function_02._M_str = (char *)in_stack_fffffffffffff968;
      logging_function_02._M_len = (size_t)in_stack_fffffffffffff960;
      source_file_02._M_str = in_stack_fffffffffffff958;
      source_file_02._M_len = in_stack_fffffffffffff950;
      LogPrintFormatInternal<double,double,double>
                (logging_function_02,source_file_02,iVar10,(LogFlags)in_stack_fffffffffffff900,level
                 ,in_stack_fffffffffffff948,(double *)in_stack_fffffffffffffa50,
                 (double *)in_stack_fffffffffffffa58,(double *)in_stack_fffffffffffffa60.__r);
    }
    bVar2 = CCoinsViewCache::Flush((CCoinsViewCache *)in_stack_fffffffffffff8a8);
    if (!bVar2) {
      __assert_fail("flushed",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                    ,0xc68,
                    "bool Chainstate::ConnectTip(BlockValidationState &, CBlockIndex *, const std::shared_ptr<const CBlock> &, ConnectTrace &, DisconnectedBlockTransactions &)"
                   );
    }
    bVar2 = false;
  }
  else {
    bVar2 = ValidationState<BlockValidationResult>::IsInvalid
                      ((ValidationState<BlockValidationResult> *)
                       CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
    if (bVar2) {
      InvalidBlockFound((Chainstate *)in_stack_fffffffffffff8a0,
                        (CBlockIndex *)in_stack_fffffffffffff8a8,
                        (BlockValidationState *)
                        CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff8b8,
               (char *)in_stack_fffffffffffff8b0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff8b8,
               (char *)in_stack_fffffffffffff8b0);
    CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_fffffffffffff8a8);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff8a0);
    ValidationState<BlockValidationResult>::ToString_abi_cxx11_(in_stack_fffffffffffff8d8);
    in_stack_fffffffffffff8b8 = (Chainstate *)&stack0xfffffffffffffd90;
    in_stack_fffffffffffff8b0 = (CBlockIndex *)&stack0xfffffffffffffdd0;
    in_stack_fffffffffffff8a8 = "ConnectTip";
    in_stack_fffffffffffff8a0 = "%s: ConnectBlock %s failed, %s\n";
    in_stack_fffffffffffff898 = 4;
    logging_function_01._M_str = (char *)in_stack_fffffffffffff968;
    logging_function_01._M_len = (size_t)in_stack_fffffffffffff960;
    source_file_01._M_str = in_stack_fffffffffffff958;
    source_file_01._M_len = in_stack_fffffffffffff950;
    LogPrintFormatInternal<char[11],std::__cxx11::string,std::__cxx11::string>
              (logging_function_01,source_file_01,iVar10,(LogFlags)in_stack_fffffffffffff900,level,
               in_stack_fffffffffffff948,in_stack_fffffffffffffa50,in_stack_fffffffffffffa58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffa60.__r);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
    local_4d1 = 0;
    bVar2 = true;
  }
  CCoinsViewCache::~CCoinsViewCache
            ((CCoinsViewCache *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
  if (!bVar2) {
    std::chrono::_V2::steady_clock::now();
    std::chrono::operator-
              ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffff8a0,
               (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
    std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator+=
              ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffff8a8,
               (duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffff8a0);
    bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),Trace)
    ;
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff8b8,
                 (char *)in_stack_fffffffffffff8b0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff8b8,
                 (char *)in_stack_fffffffffffff8b0);
      std::chrono::operator-
                ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)in_stack_fffffffffffff8a0,
                 (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
      rVar8 = Ticks<std::chrono::duration<double,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                        ((duration<long,_std::ratio<1L,_1000000000L>_>)in_stack_fffffffffffff8a8);
      nManualPruneHeight = (undefined4)((ulong)rVar8 >> 0x20);
      local_3b0 = (in_RDI->m_chainman->time_flush).__r;
      local_3a8 = Ticks<std::chrono::duration<double,std::ratio<1l,1l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                            ((duration<long,_std::ratio<1L,_1000000000L>_>)in_stack_fffffffffffff8a8
                            );
      local_3c0 = (ChainstateManager *)(in_RDI->m_chainman->time_flush).__r;
      rVar8 = Ticks<std::chrono::duration<double,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                        ((duration<long,_std::ratio<1L,_1000000000L>_>)in_stack_fffffffffffff8a8);
      local_3b8 = rVar8 / (double)in_RDI->m_chainman->num_blocks_total;
      in_stack_fffffffffffff8b8 = (Chainstate *)&stack0xfffffffffffffc48;
      in_stack_fffffffffffff8b0 = (CBlockIndex *)&stack0xfffffffffffffc58;
      in_stack_fffffffffffff8a8 = &stack0xfffffffffffffc60;
      in_stack_fffffffffffff8a0 = "  - Flush: %.2fms [%.2fs (%.2fms/blk)]\n";
      in_stack_fffffffffffff898 = 1;
      logging_function_03._M_str = (char *)in_stack_fffffffffffff968;
      logging_function_03._M_len = (size_t)in_stack_fffffffffffff960;
      source_file_03._M_str = in_stack_fffffffffffff958;
      source_file_03._M_len = in_stack_fffffffffffff950;
      LogPrintFormatInternal<double,double,double>
                (logging_function_03,source_file_03,iVar10,(LogFlags)in_stack_fffffffffffff900,level
                 ,in_stack_fffffffffffff948,(double *)in_stack_fffffffffffffa50,
                 (double *)in_stack_fffffffffffffa58,(double *)in_stack_fffffffffffffa60.__r);
    }
    bVar2 = FlushStateToDisk((Chainstate *)in_stack_fffffffffffffb78,
                             (BlockValidationState *)in_stack_fffffffffffffb70,
                             in_stack_fffffffffffffb6c,nManualPruneHeight);
    if (bVar2) {
      local_3c8 = (BlockManager *)std::chrono::_V2::steady_clock::now();
      local_3d0 = (CBlockIndex *)
                  std::chrono::operator-
                            ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)in_stack_fffffffffffff8a0,
                             (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
      std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator+=
                ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffff8a8,
                 (duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffff8a0);
      uVar3 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                                  Trace);
      if ((bool)uVar3) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff8b8,
                   (char *)in_stack_fffffffffffff8b0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff8b8,
                   (char *)in_stack_fffffffffffff8b0);
        in_stack_fffffffffffff970 =
             std::chrono::operator-
                       ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         *)in_stack_fffffffffffff8a0,
                        (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
        in_stack_fffffffffffff968 =
             (ChainstateManager *)
             Ticks<std::chrono::duration<double,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                       ((duration<long,_std::ratio<1L,_1000000000L>_>)in_stack_fffffffffffff8a8);
        local_410._8_8_ = (in_RDI->m_chainman->time_chainstate).__r;
        local_3f8._0_8_ = in_stack_fffffffffffff968;
        in_stack_fffffffffffff960 =
             Ticks<std::chrono::duration<double,std::ratio<1l,1l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                       ((duration<long,_std::ratio<1L,_1000000000L>_>)in_stack_fffffffffffff8a8);
        local_418 = (pointer)(in_RDI->m_chainman->time_chainstate).__r;
        local_410._16_8_ = in_stack_fffffffffffff960;
        in_stack_fffffffffffff958 =
             (char *)Ticks<std::chrono::duration<double,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                               ((duration<long,_std::ratio<1L,_1000000000L>_>)
                                in_stack_fffffffffffff8a8);
        local_410._0_8_ =
             (double)in_stack_fffffffffffff958 / (double)in_RDI->m_chainman->num_blocks_total;
        in_stack_fffffffffffff8b8 = (Chainstate *)local_410;
        in_stack_fffffffffffff8b0 = (CBlockIndex *)(local_410 + 0x10);
        in_stack_fffffffffffff8a8 = (char *)&local_3f8;
        in_stack_fffffffffffff8a0 = "  - Writing chainstate: %.2fms [%.2fs (%.2fms/blk)]\n";
        in_stack_fffffffffffff898 = 1;
        logging_function_04._M_str = (char *)in_stack_fffffffffffff968;
        logging_function_04._M_len = (size_t)in_stack_fffffffffffff960;
        source_file_04._M_str = in_stack_fffffffffffff958;
        source_file_04._M_len = in_stack_fffffffffffff950;
        LogPrintFormatInternal<double,double,double>
                  (logging_function_04,source_file_04,iVar10,(LogFlags)in_stack_fffffffffffff900,
                   level,in_stack_fffffffffffff948,(double *)in_stack_fffffffffffffa50,
                   (double *)in_stack_fffffffffffffa58,(double *)in_stack_fffffffffffffa60.__r);
      }
      if (in_RDI->m_mempool != (CTxMemPool *)0x0) {
        CTxMemPool::removeForBlock(in_stack_fffffffffffff930,in_stack_fffffffffffff928,nBlockHeight)
        ;
        DisconnectedBlockTransactions::removeForBlock
                  ((DisconnectedBlockTransactions *)
                   CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0),
                   in_stack_fffffffffffff8c8);
      }
      CChain::SetTip((CChain *)in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
      UpdateTip((Chainstate *)CONCAT17(uVar3,in_stack_fffffffffffff978),
                (CBlockIndex *)in_stack_fffffffffffff970.__r);
      local_420 = (ChainstateManager *)std::chrono::_V2::steady_clock::now();
      tVar5 = std::chrono::operator-
                        ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)in_stack_fffffffffffff8a0,
                         (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
      local_428 = (BlockManager *)tVar5;
      std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator+=
                ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffff8a8,
                 (duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffff8a0);
      fmt = std::chrono::operator-
                      ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)in_stack_fffffffffffff8a0,
                       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
      local_430 = fmt;
      std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator+=
                ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffff8a8,
                 (duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffff8a0);
      bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                                  Trace);
      if (bVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff8b8,
                   (char *)in_stack_fffffffffffff8b0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff8b8,
                   (char *)in_stack_fffffffffffff8b0);
        in_stack_fffffffffffffa60 =
             std::chrono::operator-
                       ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         *)in_stack_fffffffffffff8a0,
                        (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
        local_458._0_8_ =
             Ticks<std::chrono::duration<double,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                       ((duration<long,_std::ratio<1L,_1000000000L>_>)in_stack_fffffffffffff8a8);
        local_470._8_8_ = (in_RDI->m_chainman->time_post_connect).__r;
        local_470._16_8_ =
             Ticks<std::chrono::duration<double,std::ratio<1l,1l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                       ((duration<long,_std::ratio<1L,_1000000000L>_>)in_stack_fffffffffffff8a8);
        rVar8 = Ticks<std::chrono::duration<double,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                          ((duration<long,_std::ratio<1L,_1000000000L>_>)in_stack_fffffffffffff8a8);
        local_470._0_8_ = rVar8 / (double)in_RDI->m_chainman->num_blocks_total;
        in_stack_fffffffffffff8b8 = (Chainstate *)local_470;
        in_stack_fffffffffffff8b0 = (CBlockIndex *)(local_470 + 0x10);
        in_stack_fffffffffffff8a8 = (char *)&local_458;
        in_stack_fffffffffffff8a0 = "  - Connect postprocess: %.2fms [%.2fs (%.2fms/blk)]\n";
        in_stack_fffffffffffff898 = 1;
        logging_function_05._M_str = (char *)in_stack_fffffffffffff968;
        logging_function_05._M_len = (size_t)in_stack_fffffffffffff960;
        source_file_05._M_str = in_stack_fffffffffffff958;
        source_file_05._M_len = tVar5.__r;
        LogPrintFormatInternal<double,double,double>
                  (logging_function_05,source_file_05,iVar10,(LogFlags)in_stack_fffffffffffff900,
                   level,(ConstevalFormatString<3U>)fmt.__r,(double *)in_stack_fffffffffffffa50,
                   (double *)in_stack_fffffffffffffa58,(double *)in_stack_fffffffffffffa60.__r);
      }
      bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                                  Trace);
      if (bVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff8b8,
                   (char *)in_stack_fffffffffffff8b0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff8b8,
                   (char *)in_stack_fffffffffffff8b0);
        args_1 = "- Connect block: %.2fms [%.2fs (%.2fms/blk)]\n";
        args = std::chrono::operator-
                         ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                           *)in_stack_fffffffffffff8a0,
                          (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                           *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
        p_Var7 = (__pthread_internal_list *)
                 Ticks<std::chrono::duration<double,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                           ((duration<long,_std::ratio<1L,_1000000000L>_>)in_stack_fffffffffffff8a8)
        ;
        local_4b0 = (in_RDI->m_chainman->time_total).__r;
        local_4a0 = p_Var7;
        rVar8 = Ticks<std::chrono::duration<double,std::ratio<1l,1l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                          ((duration<long,_std::ratio<1L,_1000000000L>_>)in_stack_fffffffffffff8a8);
        iVar10 = (int)((ulong)p_Var7 >> 0x20);
        local_4a8 = rVar8;
        rVar9 = Ticks<std::chrono::duration<double,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                          ((duration<long,_std::ratio<1L,_1000000000L>_>)in_stack_fffffffffffff8a8);
        local_4b8 = rVar9 / (double)in_RDI->m_chainman->num_blocks_total;
        in_stack_fffffffffffff8b8 = (Chainstate *)&stack0xfffffffffffffb48;
        in_stack_fffffffffffff8b0 = (CBlockIndex *)&stack0xfffffffffffffb58;
        in_stack_fffffffffffff8a8 = (char *)&stack0xfffffffffffffb60;
        in_stack_fffffffffffff898 = 1;
        logging_function_06._M_str = (char *)in_stack_fffffffffffff968;
        logging_function_06._M_len = (size_t)in_stack_fffffffffffff960;
        source_file_06._M_str = in_stack_fffffffffffff958;
        source_file_06._M_len = tVar5.__r;
        LogPrintFormatInternal<double,double,double>
                  (logging_function_06,source_file_06,iVar10,(LogFlags)rVar8,level,
                   (ConstevalFormatString<3U>)fmt.__r,(double *)args.__r,(double *)args_1,
                   (double *)in_stack_fffffffffffffa60.__r);
      }
      pCVar6 = ChainstateManager::ActiveChainstate((ChainstateManager *)in_stack_fffffffffffff8a8);
      if (in_RDI != pCVar6) {
        ChainstateManager::MaybeCompleteSnapshotValidation(in_stack_fffffffffffff968);
      }
      std::shared_ptr<const_CBlock>::shared_ptr
                ((shared_ptr<const_CBlock> *)
                 CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                 (shared_ptr<const_CBlock> *)0x1495b00);
      ConnectTrace::BlockConnected
                ((ConnectTrace *)in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0,
                 (shared_ptr<const_CBlock> *)in_stack_fffffffffffff8a8);
      std::shared_ptr<const_CBlock>::~shared_ptr
                ((shared_ptr<const_CBlock> *)
                 CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
      local_4d1 = 1;
    }
    else {
      local_4d1 = 0;
    }
  }
LAB_01495b5f:
  std::shared_ptr<const_CBlock>::~shared_ptr
            ((shared_ptr<const_CBlock> *)
             CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(local_4d1 & 1);
}

Assistant:

bool Chainstate::ConnectTip(BlockValidationState& state, CBlockIndex* pindexNew, const std::shared_ptr<const CBlock>& pblock, ConnectTrace& connectTrace, DisconnectedBlockTransactions& disconnectpool)
{
    AssertLockHeld(cs_main);
    if (m_mempool) AssertLockHeld(m_mempool->cs);

    assert(pindexNew->pprev == m_chain.Tip());
    // Read block from disk.
    const auto time_1{SteadyClock::now()};
    std::shared_ptr<const CBlock> pthisBlock;
    if (!pblock) {
        std::shared_ptr<CBlock> pblockNew = std::make_shared<CBlock>();
        if (!m_blockman.ReadBlockFromDisk(*pblockNew, *pindexNew)) {
            return FatalError(m_chainman.GetNotifications(), state, _("Failed to read block."));
        }
        pthisBlock = pblockNew;
    } else {
        LogDebug(BCLog::BENCH, "  - Using cached block\n");
        pthisBlock = pblock;
    }
    const CBlock& blockConnecting = *pthisBlock;
    // Apply the block atomically to the chain state.
    const auto time_2{SteadyClock::now()};
    SteadyClock::time_point time_3;
    // When adding aggregate statistics in the future, keep in mind that
    // num_blocks_total may be zero until the ConnectBlock() call below.
    LogDebug(BCLog::BENCH, "  - Load block from disk: %.2fms\n",
             Ticks<MillisecondsDouble>(time_2 - time_1));
    {
        CCoinsViewCache view(&CoinsTip());
        bool rv = ConnectBlock(blockConnecting, state, pindexNew, view);
        if (m_chainman.m_options.signals) {
            m_chainman.m_options.signals->BlockChecked(blockConnecting, state);
        }
        if (!rv) {
            if (state.IsInvalid())
                InvalidBlockFound(pindexNew, state);
            LogError("%s: ConnectBlock %s failed, %s\n", __func__, pindexNew->GetBlockHash().ToString(), state.ToString());
            return false;
        }
        time_3 = SteadyClock::now();
        m_chainman.time_connect_total += time_3 - time_2;
        assert(m_chainman.num_blocks_total > 0);
        LogDebug(BCLog::BENCH, "  - Connect total: %.2fms [%.2fs (%.2fms/blk)]\n",
                 Ticks<MillisecondsDouble>(time_3 - time_2),
                 Ticks<SecondsDouble>(m_chainman.time_connect_total),
                 Ticks<MillisecondsDouble>(m_chainman.time_connect_total) / m_chainman.num_blocks_total);
        bool flushed = view.Flush();
        assert(flushed);
    }
    const auto time_4{SteadyClock::now()};
    m_chainman.time_flush += time_4 - time_3;
    LogDebug(BCLog::BENCH, "  - Flush: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_4 - time_3),
             Ticks<SecondsDouble>(m_chainman.time_flush),
             Ticks<MillisecondsDouble>(m_chainman.time_flush) / m_chainman.num_blocks_total);
    // Write the chain state to disk, if necessary.
    if (!FlushStateToDisk(state, FlushStateMode::IF_NEEDED)) {
        return false;
    }
    const auto time_5{SteadyClock::now()};
    m_chainman.time_chainstate += time_5 - time_4;
    LogDebug(BCLog::BENCH, "  - Writing chainstate: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_5 - time_4),
             Ticks<SecondsDouble>(m_chainman.time_chainstate),
             Ticks<MillisecondsDouble>(m_chainman.time_chainstate) / m_chainman.num_blocks_total);
    // Remove conflicting transactions from the mempool.;
    if (m_mempool) {
        m_mempool->removeForBlock(blockConnecting.vtx, pindexNew->nHeight);
        disconnectpool.removeForBlock(blockConnecting.vtx);
    }
    // Update m_chain & related variables.
    m_chain.SetTip(*pindexNew);
    UpdateTip(pindexNew);

    const auto time_6{SteadyClock::now()};
    m_chainman.time_post_connect += time_6 - time_5;
    m_chainman.time_total += time_6 - time_1;
    LogDebug(BCLog::BENCH, "  - Connect postprocess: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_6 - time_5),
             Ticks<SecondsDouble>(m_chainman.time_post_connect),
             Ticks<MillisecondsDouble>(m_chainman.time_post_connect) / m_chainman.num_blocks_total);
    LogDebug(BCLog::BENCH, "- Connect block: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_6 - time_1),
             Ticks<SecondsDouble>(m_chainman.time_total),
             Ticks<MillisecondsDouble>(m_chainman.time_total) / m_chainman.num_blocks_total);

    // If we are the background validation chainstate, check to see if we are done
    // validating the snapshot (i.e. our tip has reached the snapshot's base block).
    if (this != &m_chainman.ActiveChainstate()) {
        // This call may set `m_disabled`, which is referenced immediately afterwards in
        // ActivateBestChain, so that we stop connecting blocks past the snapshot base.
        m_chainman.MaybeCompleteSnapshotValidation();
    }

    connectTrace.BlockConnected(pindexNew, std::move(pthisBlock));
    return true;
}